

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.c
# Opt level: O0

int MD5_Final(uchar *md,MD5_CTX *c)

{
  void *pvVar1;
  uint local_2c;
  uint padLen;
  uint count;
  uchar bits [8];
  md5_ctx *context_local;
  uchar *digest_local;
  
  bits = (uchar  [8])c;
  Encode((uchar *)&padLen,&c->Nl,8);
  local_2c = *(uint *)((long)bits + 0x10) >> 3 & 0x3f;
  if (local_2c < 0x38) {
    local_2c = 0x38 - local_2c;
  }
  else {
    local_2c = 0x78 - local_2c;
  }
  MD5_Update((MD5_CTX *)bits,PADDING,(ulong)local_2c);
  MD5_Update((MD5_CTX *)bits,&padLen,8);
  Encode(md,(UINT4 *)bits,0x10);
  pvVar1 = memset((void *)bits,0,0x58);
  return (int)pvVar1;
}

Assistant:

static void MD5_Final(unsigned char digest[16], /* message digest */
                      struct md5_ctx *context) /* context */
{
  unsigned char bits[8];
  unsigned int count, padLen;

  /* Save number of bits */
  Encode (bits, context->count, 8);

  /* Pad out to 56 mod 64. */
  count = (unsigned int)((context->count[0] >> 3) & 0x3f);
  padLen = (count < 56) ? (56 - count) : (120 - count);
  MD5_Update (context, PADDING, padLen);

  /* Append length (before padding) */
  MD5_Update (context, bits, 8);

  /* Store state in digest */
  Encode (digest, context->state, 16);

  /* Zeroize sensitive information. */
  memset ((void *)context, 0, sizeof (*context));
}